

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O1

void Fxch_ManDivCreate(Fxch_Man_t *pFxchMan)

{
  int *piVar1;
  float *pfVar2;
  Vec_Que_t *pVVar3;
  ulong uVar4;
  int *piVar5;
  Vec_Flt_t *pVVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  float fVar16;
  float fVar17;
  
  if (0 < pFxchMan->vCubes->nSize) {
    iVar8 = 0;
    do {
      Fxch_ManDivSingleCube(pFxchMan,iVar8,1,0);
      Fxch_ManDivDoubleCube(pFxchMan,iVar8,1,0);
      iVar8 = iVar8 + 1;
    } while (iVar8 < pFxchMan->vCubes->nSize);
  }
  pVVar6 = pFxchMan->vDivWeights;
  uVar10 = pVVar6->nSize;
  pVVar3 = (Vec_Que_t *)calloc(1,0x20);
  uVar4 = 0x10;
  if (0x10 < (int)uVar10) {
    uVar4 = (ulong)uVar10;
  }
  pVVar3->nSize = 1;
  pVVar3->nCap = (int)uVar4 + 1;
  sVar15 = uVar4 * 4 + 4;
  piVar5 = (int *)malloc(sVar15);
  memset(piVar5,0xff,sVar15);
  pVVar3->pHeap = piVar5;
  piVar5 = (int *)malloc(sVar15);
  memset(piVar5,0xff,sVar15);
  pVVar3->pOrder = piVar5;
  pFxchMan->vDivPrio = pVVar3;
  if (pVVar3->pCostsFlt != (float **)0x0) {
    __assert_fail("p->pCostsFlt == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
  }
  pVVar3->pCostsFlt = &pVVar6->pArray;
  pVVar6 = pFxchMan->vDivWeights;
  if (0 < pVVar6->nSize) {
    uVar4 = 0;
    do {
      if (0.0 < pVVar6->pArray[uVar4]) {
        pVVar3 = pFxchMan->vDivPrio;
        iVar8 = pVVar3->nCap;
        if (iVar8 <= pVVar3->nSize) {
          iVar9 = pVVar3->nSize + 1;
          iVar13 = iVar8 * 2;
          if (iVar9 == iVar13 || SBORROW4(iVar9,iVar13) != iVar9 + iVar8 * -2 < 0) {
            iVar9 = iVar13;
          }
          if (iVar8 < iVar9) {
            lVar14 = (long)iVar9;
            sVar15 = lVar14 * 4;
            if (pVVar3->pHeap == (int *)0x0) {
              piVar5 = (int *)malloc(sVar15);
            }
            else {
              piVar5 = (int *)realloc(pVVar3->pHeap,sVar15);
            }
            pVVar3->pHeap = piVar5;
            if (pVVar3->pOrder == (int *)0x0) {
              piVar5 = (int *)malloc(sVar15);
            }
            else {
              piVar5 = (int *)realloc(pVVar3->pOrder,sVar15);
            }
            pVVar3->pOrder = piVar5;
            memset(pVVar3->pHeap + pVVar3->nCap,0xff,(lVar14 - pVVar3->nCap) * 4);
            memset(pVVar3->pOrder + pVVar3->nCap,0xff,(lVar14 - pVVar3->nCap) * 4);
            pVVar3->nCap = iVar9;
          }
        }
        iVar8 = pVVar3->nCap;
        iVar13 = (int)uVar4;
        if ((long)iVar8 <= (long)uVar4) {
          uVar10 = iVar8 * 2;
          uVar7 = iVar13 + 1;
          if (uVar7 != uVar10 && SBORROW4(uVar7,uVar10) == (int)(uVar7 + iVar8 * -2) < 0) {
            uVar10 = uVar7;
          }
          if (iVar8 < (int)uVar10) {
            sVar15 = (ulong)uVar10 * 4;
            if (pVVar3->pHeap == (int *)0x0) {
              piVar5 = (int *)malloc(sVar15);
            }
            else {
              piVar5 = (int *)realloc(pVVar3->pHeap,sVar15);
            }
            pVVar3->pHeap = piVar5;
            sVar15 = (ulong)uVar10 << 2;
            if (pVVar3->pOrder == (int *)0x0) {
              piVar5 = (int *)malloc(sVar15);
            }
            else {
              piVar5 = (int *)realloc(pVVar3->pOrder,sVar15);
            }
            pVVar3->pOrder = piVar5;
            memset(pVVar3->pHeap + pVVar3->nCap,0xff,((long)(int)uVar10 - (long)pVVar3->nCap) * 4);
            memset(pVVar3->pOrder + pVVar3->nCap,0xff,((long)(int)uVar10 - (long)pVVar3->nCap) * 4);
            pVVar3->nCap = uVar10;
          }
        }
        iVar8 = pVVar3->nSize;
        if (pVVar3->nCap <= iVar8) {
          __assert_fail("p->nSize < p->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar5 = pVVar3->pOrder;
        if (piVar5[uVar4] != -1) {
          __assert_fail("p->pOrder[v] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar1 = pVVar3->pHeap;
        if (piVar1[iVar8] != -1) {
          __assert_fail("p->pHeap[p->nSize] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar5[uVar4] = iVar8;
        iVar8 = pVVar3->nSize;
        pVVar3->nSize = iVar8 + 1;
        piVar1[iVar8] = iVar13;
        pfVar2 = *pVVar3->pCostsFlt;
        if (pfVar2 == (float *)0x0) {
          fVar16 = (float)iVar13;
        }
        else {
          fVar16 = pfVar2[uVar4];
        }
        uVar10 = piVar5[uVar4];
        uVar11 = (ulong)(int)uVar10;
        if (uVar11 == 0xffffffffffffffff) {
          __assert_fail("p->pOrder[v] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
        }
        if (uVar4 != (uint)piVar1[uVar11]) {
          __assert_fail("p->pHeap[i] == v",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
        }
        if (1 < (int)uVar10) {
          do {
            uVar7 = (uint)uVar11;
            uVar12 = uVar11 >> 1 & 0x7fffffff;
            iVar8 = piVar1[uVar12];
            if (pfVar2 == (float *)0x0) {
              fVar17 = (float)iVar8;
            }
            else {
              fVar17 = pfVar2[iVar8];
            }
            uVar10 = uVar7;
            if (fVar16 <= fVar17) break;
            piVar1[uVar11 & 0xffffffff] = iVar8;
            piVar5[iVar8] = uVar7;
            uVar11 = uVar12;
            uVar10 = (uint)uVar12;
          } while (3 < uVar7);
        }
        piVar1[(int)uVar10] = iVar13;
        piVar5[uVar4] = uVar10;
      }
      uVar4 = uVar4 + 1;
      pVVar6 = pFxchMan->vDivWeights;
    } while ((long)uVar4 < (long)pVVar6->nSize);
  }
  return;
}

Assistant:

void Fxch_ManDivCreate( Fxch_Man_t* pFxchMan )
{
    Vec_Int_t* vCube;
    float Weight;
    int fAdd = 1,
        fUpdate = 0,
        iCube;

    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, iCube )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube, fAdd, fUpdate );
        Fxch_ManDivDoubleCube( pFxchMan, iCube, fAdd, fUpdate );
    }

    pFxchMan->vDivPrio = Vec_QueAlloc( Vec_FltSize( pFxchMan->vDivWeights ) );
    Vec_QueSetPriority( pFxchMan->vDivPrio, Vec_FltArrayP( pFxchMan->vDivWeights ) );
    Vec_FltForEachEntry( pFxchMan->vDivWeights, Weight, iCube )
    {
        if ( Weight > 0.0 )
            Vec_QuePush( pFxchMan->vDivPrio, iCube );
    }
}